

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::WeightParams::_internal_add_floatvalue(WeightParams *this,float value)

{
  float local_4;
  
  google::protobuf::RepeatedField<float>::Add(&this->floatvalue_,&local_4);
  return;
}

Assistant:

inline void WeightParams::_internal_add_floatvalue(float value) {
  floatvalue_.Add(value);
}